

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::dump_path_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Path *path)

{
  string *psVar1;
  bool bVar2;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190,"Path: Prim part = ",0x12);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190,*(char **)this,*(long *)(this + 8))
  ;
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190,", Prop part = ",0xe);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_190,*(char **)(this + 0x20),*(long *)(this + 0x28));
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190,", Variant part = ",0x11);
  psVar1 = Path::variant_part_abi_cxx11_((Path *)this);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_190,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190,", elementName = ",0x10);
  psVar1 = Path::element_name_abi_cxx11_((Path *)this);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_190,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190,", isValid = ",0xc);
  bVar2 = SUB81(local_190,0);
  ::std::ostream::_M_insert<bool>(bVar2);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190,", isAbsolute = ",0xf);
  ::std::ostream::_M_insert<bool>(bVar2);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190,", isRelative = ",0xf);
  ::std::ostream::_M_insert<bool>(bVar2);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  ::std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string dump_path(const Path &path) {
  std::stringstream ss;
  ss << "Path: Prim part = " << path.prim_part();
  ss << ", Prop part = " << path.prop_part();
  ss << ", Variant part = " << path.variant_part();
  ss << ", elementName = " << path.element_name();
  ss << ", isValid = " << path.is_valid();
  ss << ", isAbsolute = " << path.is_absolute_path();
  ss << ", isRelative = " << path.is_relative_path();

  return ss.str();
}